

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O0

TestCaseGroup * deqp::gles3::Functional::createLifetimeTests(Context *context)

{
  TestGroup *this;
  Context *context_local;
  
  this = (TestGroup *)operator_new(0x88);
  anon_unknown_0::TestGroup::TestGroup(this,context);
  return &this->super_TestCaseGroup;
}

Assistant:

TestCaseGroup* createLifetimeTests (Context& context)
{
	return new TestGroup(context);
}